

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

void require_numeric_datatype(Context_conflict *ctx,MOJOSHADER_astDataType *datatype)

{
  MOJOSHADER_astDataTypeType MVar1;
  MOJOSHADER_astDataType *pMVar2;
  
  pMVar2 = reduce_datatype(ctx,datatype);
  MVar1 = pMVar2->type;
  if ((MVar1 & ~MOJOSHADER_AST_DATATYPE_BOOL) == MOJOSHADER_AST_DATATYPE_VECTOR) {
    pMVar2 = reduce_datatype(ctx,(pMVar2->array).base);
    MVar1 = pMVar2->type;
  }
  if ((MVar1 < MOJOSHADER_AST_DATATYPE_STRING) &&
     ((0x19eU >> (MVar1 & (MOJOSHADER_AST_DATATYPE_STRUCT|
                          MOJOSHADER_AST_DATATYPE_SAMPLER_COMPARISON_STATE)) & 1) != 0)) {
    return;
  }
  failf(ctx,"%s","Expected numeric type");
  return;
}

Assistant:

static void require_numeric_datatype(Context *ctx,
                                     const MOJOSHADER_astDataType *datatype)
{
    datatype = reduce_datatype(ctx, datatype);
    if (datatype->type == MOJOSHADER_AST_DATATYPE_VECTOR)
        datatype = reduce_datatype(ctx, datatype->vector.base);
    else if (datatype->type == MOJOSHADER_AST_DATATYPE_MATRIX)
        datatype = reduce_datatype(ctx, datatype->matrix.base);

    switch (datatype->type)
    {
        case MOJOSHADER_AST_DATATYPE_BOOL:
        case MOJOSHADER_AST_DATATYPE_INT:
        case MOJOSHADER_AST_DATATYPE_UINT:
        case MOJOSHADER_AST_DATATYPE_HALF:
        case MOJOSHADER_AST_DATATYPE_FLOAT:
        case MOJOSHADER_AST_DATATYPE_DOUBLE:
            return;
        default: break;
    } // switch

    fail(ctx, "Expected numeric type");  // !!! FIXME: fmt.
    // !!! FIXME: replace AST node with an AST_OP_INT_LITERAL zero, keep going.
}